

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infomessages.cpp
# Opt level: O1

void __thiscall CInfoMessages::RenderKillMsg(CInfoMessages *this,CInfoMsg *pInfoMsg,float x,float y)

{
  ITextRender *pIVar1;
  CGameClient *pCVar2;
  IGraphics *pIVar3;
  vec2 CursorPosition;
  vec2 Pos;
  vec2 Pos_00;
  vec2 CursorPosition_00;
  CAnimState *pCVar4;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  float fVar7;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 y_00;
  float fVar9;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar10;
  vec4 local_48;
  vec4 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  fVar9 = (pInfoMsg->m_Player2NameCursor).m_Width;
  fVar5 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,36.0);
  fVar7 = (pInfoMsg->m_Player1NameCursor).m_Width;
  fVar6 = CUI::GetClientIDRectWidth(&((this->super_CComponent).m_pClient)->m_UI,36.0);
  aVar10.x = x - (fVar6 + fVar7);
  local_38.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_38.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_38.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_38.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
  local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
  local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
  local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
  local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
  CursorPosition.field_1.y = y;
  CursorPosition.field_0.x = aVar10.x;
  fVar7 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                            (pInfoMsg->m_Player1NameCursor).m_FontSize,CursorPosition,
                            pInfoMsg->m_Player1ID,&local_38,&local_48);
  (pInfoMsg->m_Player1NameCursor).m_CursorPos.field_0.x = fVar7 + aVar10.x;
  (pInfoMsg->m_Player1NameCursor).m_CursorPos.field_1.y = y;
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pTextRender;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,pIVar1,&pInfoMsg->m_Player1NameCursor,0);
  aVar8.x = aVar10.x + -24.0;
  pCVar2 = (this->super_CComponent).m_pClient;
  if ((((pCVar2->m_GameInfo).m_GameFlags & 2) != 0) && ((pInfoMsg->m_ModeSpecial & 1) != 0)) {
    (*(pCVar2->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
              (pIVar3,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    CRenderTools::SelectSprite
              (&((this->super_CComponent).m_pClient)->m_RenderTools,
               (pInfoMsg->m_Player1ID != pInfoMsg->m_FlagCarrierBlue) + 0x3f,0,0,0);
    local_38.field_1.y = y + -16.0;
    local_38.field_0.x = aVar8.x;
    local_38.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x41e00000;
    local_38.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x42600000;
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_38,1);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
  }
  pCVar2 = (this->super_CComponent).m_pClient;
  pCVar4 = CAnimState::GetIdle();
  y_00.y = y + 28.0;
  Pos.field_1.y = y_00.y;
  Pos.field_0.x = aVar8.x;
  CRenderTools::RenderTee
            (&pCVar2->m_RenderTools,pCVar4,&pInfoMsg->m_Player1RenderInfo,1,(vec2)0xbf800000,Pos);
  fVar7 = aVar8.x + -32.0 + -44.0;
  if (-1 < pInfoMsg->m_Weapon) {
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
              (pIVar3,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    CRenderTools::SelectSprite
              (&((this->super_CComponent).m_pClient)->m_RenderTools,
               (g_pData->m_Weapons).m_aId[pInfoMsg->m_Weapon].m_pSpriteBody,0,0,0);
    CRenderTools::DrawSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,fVar7,y_00.y,96.0)
    ;
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
  }
  if (pInfoMsg->m_Player1ID != pInfoMsg->m_Player2ID) {
    fVar7 = fVar7 + -52.0;
    pCVar2 = (this->super_CComponent).m_pClient;
    if ((((pCVar2->m_GameInfo).m_GameFlags & 2) != 0) && ((pInfoMsg->m_ModeSpecial & 2) != 0)) {
      (*(pCVar2->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])
                (pIVar3,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17]
      )();
      CRenderTools::SelectSprite
                (&((this->super_CComponent).m_pClient)->m_RenderTools,
                 (pInfoMsg->m_Player2ID != pInfoMsg->m_FlagCarrierBlue) + 0x3f,2,0,0);
      local_38.field_1.y = y + -16.0;
      local_38.field_0.x = fVar7 + -56.0;
      local_38.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x41e00000;
      local_38.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x42600000;
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x1d])(pIVar3,&local_38,1);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18]
      )();
    }
    aVar10.x = fVar7 + -24.0;
    pCVar2 = (this->super_CComponent).m_pClient;
    pCVar4 = CAnimState::GetIdle();
    Pos_00.field_1.y = y_00.y;
    Pos_00.field_0.x = aVar10.x;
    CRenderTools::RenderTee
              (&pCVar2->m_RenderTools,pCVar4,&pInfoMsg->m_Player2RenderInfo,4,(vec2)0x3f800000,
               Pos_00);
    if (-1 < pInfoMsg->m_Player2ID) {
      aVar10.x = (aVar10.x + -32.0) - (fVar9 + fVar5);
      local_38.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
      local_38.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
      local_38.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
      local_38.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f000000;
      local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3dcccccd;
      local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3dcccccd;
      local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3dcccccd;
      local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
      CursorPosition_00.field_1.y = y;
      CursorPosition_00.field_0.x = aVar10.x;
      fVar9 = CUI::DrawClientID(&((this->super_CComponent).m_pClient)->m_UI,
                                (pInfoMsg->m_Player2NameCursor).m_FontSize,CursorPosition_00,
                                pInfoMsg->m_Player2ID,&local_38,&local_48);
      (pInfoMsg->m_Player2NameCursor).m_CursorPos.field_0.x = fVar9 + aVar10.x;
      (pInfoMsg->m_Player2NameCursor).m_CursorPos.field_1.y = y;
      pIVar1 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])
                (0x3f800000,pIVar1,&pInfoMsg->m_Player2NameCursor,0,0xffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CInfoMessages::RenderKillMsg(CInfoMsg *pInfoMsg, float x, float y) const
{
	float FontSize = 36.0f;
	float KillerNameW = pInfoMsg->m_Player2NameCursor.Width() + UI()->GetClientIDRectWidth(FontSize);
	float VictimNameW = pInfoMsg->m_Player1NameCursor.Width() + UI()->GetClientIDRectWidth(FontSize);

	// render victim name
	x -= VictimNameW;
	float AdvanceID = UI()->DrawClientID(pInfoMsg->m_Player1NameCursor.m_FontSize, vec2(x, y), pInfoMsg->m_Player1ID);
	pInfoMsg->m_Player1NameCursor.MoveTo(x + AdvanceID, y);
	TextRender()->DrawTextOutlined(&pInfoMsg->m_Player1NameCursor);

	// render victim tee
	x -= 24.0f;

	if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_FLAGS)
	{
		if(pInfoMsg->m_ModeSpecial&1)
		{
			Graphics()->BlendNormal();
			Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
			Graphics()->QuadsBegin();

			if(pInfoMsg->m_Player1ID == pInfoMsg->m_FlagCarrierBlue)
				RenderTools()->SelectSprite(SPRITE_FLAG_BLUE);
			else
				RenderTools()->SelectSprite(SPRITE_FLAG_RED);

			float Size = 56.0f;
			IGraphics::CQuadItem QuadItem(x, y-16, Size/2, Size);
			Graphics()->QuadsDrawTL(&QuadItem, 1);
			Graphics()->QuadsEnd();
		}
	}

	RenderTools()->RenderTee(CAnimState::GetIdle(), &pInfoMsg->m_Player1RenderInfo, EMOTE_PAIN, vec2(-1,0), vec2(x, y+28));
	x -= 32.0f;

	// render weapon
	x -= 44.0f;
	if(pInfoMsg->m_Weapon >= 0)
	{
		Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
		Graphics()->QuadsBegin();
		RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[pInfoMsg->m_Weapon].m_pSpriteBody);
		RenderTools()->DrawSprite(x, y+28, 96);
		Graphics()->QuadsEnd();
	}
	x -= 52.0f;

	if(pInfoMsg->m_Player1ID != pInfoMsg->m_Player2ID)
	{
		if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_FLAGS)
		{
			if(pInfoMsg->m_ModeSpecial&2)
			{
				Graphics()->BlendNormal();
				Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
				Graphics()->QuadsBegin();

				if(pInfoMsg->m_Player2ID == pInfoMsg->m_FlagCarrierBlue)
					RenderTools()->SelectSprite(SPRITE_FLAG_BLUE, SPRITE_FLAG_FLIP_X);
				else
					RenderTools()->SelectSprite(SPRITE_FLAG_RED, SPRITE_FLAG_FLIP_X);

				float Size = 56.0f;
				IGraphics::CQuadItem QuadItem(x-56, y-16, Size/2, Size);
				Graphics()->QuadsDrawTL(&QuadItem, 1);
				Graphics()->QuadsEnd();
			}
		}

		// render killer tee
		x -= 24.0f;
		RenderTools()->RenderTee(CAnimState::GetIdle(), &pInfoMsg->m_Player2RenderInfo, EMOTE_ANGRY, vec2(1,0), vec2(x, y+28));
		x -= 32.0f;

		if(pInfoMsg->m_Player2ID >= 0)
		{
			// render killer name
			x -= KillerNameW;
			float AdvanceID = UI()->DrawClientID(pInfoMsg->m_Player2NameCursor.m_FontSize, vec2(x, y), pInfoMsg->m_Player2ID);
			pInfoMsg->m_Player2NameCursor.MoveTo(x + AdvanceID, y);
			TextRender()->DrawTextOutlined(&pInfoMsg->m_Player2NameCursor);
		}
	}
}